

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie2_builder.cpp
# Opt level: O3

UTrie2 * utrie2_open_63(uint32_t initialValue,uint32_t errorValue,UErrorCode *pErrorCode)

{
  uint32_t *puVar1;
  int32_t *piVar2;
  UTrie2 *buffer;
  UNewTrie2 *trie;
  uint32_t *buffer_00;
  long lVar3;
  uint c;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    buffer = (UTrie2 *)uprv_malloc_63(0x50);
    trie = (UNewTrie2 *)uprv_malloc_63(0x453c0);
    buffer_00 = (uint32_t *)uprv_malloc_63(0x10000);
    if ((trie != (UNewTrie2 *)0x0 && buffer != (UTrie2 *)0x0) && buffer_00 != (uint32_t *)0x0) {
      buffer->index2NullOffset = 0;
      buffer->dataNullOffset = 0;
      buffer->initialValue = 0;
      buffer->errorValue = 0;
      buffer->highStart = 0;
      *(undefined8 *)&buffer->highValueIndex = 0;
      buffer->memory = (void *)0x0;
      buffer->data32 = (uint32_t *)0x0;
      buffer->indexLength = 0;
      buffer->dataLength = 0;
      buffer->index = (uint16_t *)0x0;
      buffer->data16 = (uint16_t *)0x0;
      buffer->length = 0;
      buffer->isMemoryOwned = '\0';
      buffer->padding1 = '\0';
      buffer->padding2 = 0;
      buffer->initialValue = initialValue;
      buffer->errorValue = errorValue;
      buffer->highStart = 0x110000;
      buffer->newTrie = trie;
      trie->data = buffer_00;
      trie->dataCapacity = 0x4000;
      trie->initialValue = initialValue;
      trie->errorValue = errorValue;
      trie->highStart = 0x110000;
      trie->firstFreeBlock = 0;
      trie->isCompacted = '\0';
      lVar3 = 0;
      do {
        puVar1 = buffer_00 + lVar3;
        *puVar1 = initialValue;
        puVar1[1] = initialValue;
        puVar1[2] = initialValue;
        puVar1[3] = initialValue;
        lVar3 = lVar3 + 4;
      } while (lVar3 != 0x80);
      lVar3 = 0;
      do {
        puVar1 = buffer_00 + lVar3 + 0x80;
        *puVar1 = errorValue;
        puVar1[1] = errorValue;
        puVar1[2] = errorValue;
        puVar1[3] = errorValue;
        lVar3 = lVar3 + 4;
      } while (lVar3 != 0x40);
      lVar3 = 0;
      do {
        puVar1 = buffer_00 + lVar3 + 0xc0;
        *puVar1 = initialValue;
        puVar1[1] = initialValue;
        puVar1[2] = initialValue;
        puVar1[3] = initialValue;
        lVar3 = lVar3 + 4;
      } while (lVar3 != 0x40);
      trie->dataNullOffset = 0xc0;
      trie->dataLength = 0x100;
      trie->index2[0] = 0;
      trie->index2[1] = 0x20;
      trie->index2[2] = 0x40;
      trie->index2[3] = 0x60;
      trie->map[0] = 1;
      trie->map[1] = 1;
      trie->map[2] = 1;
      trie->map[3] = 1;
      trie->map[4] = 0;
      trie->map[5] = 0;
      trie->map[6] = 0x881d;
      trie->map[7] = 0;
      lVar3 = 0x224;
      do {
        piVar2 = trie->index1 + lVar3;
        piVar2[0] = 0xc0;
        piVar2[1] = 0xc0;
        piVar2[2] = 0xc0;
        piVar2[3] = 0xc0;
        lVar3 = lVar3 + 4;
      } while (lVar3 != 0xa40);
      memset(trie->index2 + 0x820,0xff,0x900);
      lVar3 = 0xc80;
      do {
        piVar2 = trie->index1 + lVar3;
        piVar2[0] = 0xc0;
        piVar2[1] = 0xc0;
        piVar2[2] = 0xc0;
        piVar2[3] = 0xc0;
        lVar3 = lVar3 + 4;
      } while (lVar3 != 0xcc0);
      trie->index2NullOffset = 0xa60;
      trie->index2Length = 0xaa0;
      iVar4 = 0;
      iVar5 = 0x40;
      iVar6 = 0x80;
      iVar7 = 0xc0;
      lVar3 = 0;
      do {
        piVar2 = trie->index1 + lVar3;
        *piVar2 = iVar4;
        piVar2[1] = iVar5;
        piVar2[2] = iVar6;
        piVar2[3] = iVar7;
        lVar3 = lVar3 + 4;
        iVar4 = iVar4 + 0x100;
        iVar5 = iVar5 + 0x100;
        iVar6 = iVar6 + 0x100;
        iVar7 = iVar7 + 0x100;
      } while (lVar3 != 0x20);
      lVar3 = 0x20;
      do {
        piVar2 = trie->index1 + lVar3;
        piVar2[0] = 0xa60;
        piVar2[1] = 0xa60;
        piVar2[2] = 0xa60;
        piVar2[3] = 0xa60;
        lVar3 = lVar3 + 4;
      } while (lVar3 != 0x220);
      c = 0x60;
      do {
        c = c + 0x20;
        if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
          set32(trie,c,'\x01',initialValue,pErrorCode);
        }
      } while (c < 0x7e0);
      return buffer;
    }
    uprv_free_63(buffer);
    uprv_free_63(trie);
    uprv_free_63(buffer_00);
    *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
  }
  return (UTrie2 *)0x0;
}

Assistant:

U_CAPI void U_EXPORT2
utrie2_set32ForLeadSurrogateCodeUnit(UTrie2 *trie,
                                     UChar32 c, uint32_t value,
                                     UErrorCode *pErrorCode) {
    if(U_FAILURE(*pErrorCode)) {
        return;
    }
    if(!U_IS_LEAD(c)) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }
    set32(trie->newTrie, c, FALSE, value, pErrorCode);
}